

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

Result __thiscall
tonk::SessionOutgoing::OnAcknowledgements
          (SessionOutgoing *this,uint8_t *data,uint bytes,Counter64 *ackNonce,uint64_t receiveUsec)

{
  long lVar1;
  BandwidthShape *pBVar2;
  SiameseResult SVar3;
  _func_int **pp_Var4;
  OutputWorker *this_00;
  uint uVar5;
  uint uVar6;
  undefined4 in_register_00000014;
  uint3 *puVar7;
  long lVar8;
  undefined8 in_R9;
  uint8_t ackack [4];
  BandwidthShape shape;
  ostringstream local_1a8 [376];
  
  puVar7 = (uint3 *)CONCAT44(in_register_00000014,bytes);
  uVar5 = (uint)ackNonce;
  if (uVar5 < 6) {
    std::__cxx11::string::string((string *)&shape,"Truncated Ack",(allocator *)ackack);
    pp_Var4 = (_func_int **)operator_new(0x38);
    *pp_Var4 = (_func_int *)"SessionOutgoing::OnAcknowledgements";
    std::__cxx11::string::string((string *)(pp_Var4 + 1),(string *)&shape);
  }
  else {
    if (*(long *)receiveUsec - *(long *)(data + 0x2e8) < 0) {
      pBVar2 = *(BandwidthShape **)(data + 0x208);
      if ((int)pBVar2[1].AppBPS < 2) {
        shape = *pBVar2;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,(string *)(pBVar2 + 7));
        std::operator<<((ostream *)local_1a8,"Ignored re-ordered ack");
        this_00 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_00,(LogStringBuffer *)&shape);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
LAB_00154c16:
      (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
      return (Result)(ErrorResult *)this;
    }
    *(long *)(data + 0x2e8) = *(long *)receiveUsec + 1;
    lVar1 = *(long *)(data + 0x2f8);
    uVar6 = (uint)*puVar7 - (int)lVar1;
    lVar8 = (ulong)(uVar6 & 0xffffff) - (ulong)(uVar6 * 2 & 0x1000000);
    if (-1 < lVar8) {
      if ((uVar5 == 6) ||
         (SVar3 = siamese_encoder_ack(*(SiameseEncoder *)(data + 0x2d0),(void *)((long)puVar7 + 6),
                                      uVar5 - 6,(uint *)(data + 0x300)), SVar3 == Siamese_Success))
      {
        *(long *)(data + 0x2f8) = lVar8 + lVar1;
        *(undefined8 *)(data + 0x2f0) = in_R9;
        shape.AppBPS = 0;
        shape.FECRate = 0.0;
        BandwidthShape::Decompress(&shape,(uint8_t *)((long)puVar7 + 3));
        SenderBandwidthControl::OnReceiverFeedback(*(SenderBandwidthControl **)(data + 0x220),shape)
        ;
        ackack = *(uint8_t (*) [4])(data + 0x300);
        if (ackack == *(uint8_t (*) [4])(data + 0x308)) {
          (**(code **)(*(long *)data + 0x10))(this,data,2,ackack,3);
          return (Result)(ErrorResult *)this;
        }
        goto LAB_00154c16;
      }
      std::__cxx11::string::string
                ((string *)&shape,"siamese_encoder_ack failed",(allocator *)ackack);
      pp_Var4 = (_func_int **)operator_new(0x38);
      *pp_Var4 = (_func_int *)"SessionOutgoing::OnAcknowledgements";
      std::__cxx11::string::string((string *)(pp_Var4 + 1),(string *)&shape);
      *(undefined4 *)(pp_Var4 + 5) = 1;
      pp_Var4[6] = (_func_int *)(long)(int)SVar3;
      goto LAB_00154a5e;
    }
    std::__cxx11::string::string((string *)&shape,"Ack was sent out of order",(allocator *)ackack);
    pp_Var4 = (_func_int **)operator_new(0x38);
    *pp_Var4 = (_func_int *)"SessionOutgoing::OnAcknowledgements";
    std::__cxx11::string::string((string *)(pp_Var4 + 1),(string *)&shape);
  }
  *(undefined4 *)(pp_Var4 + 5) = 0;
  pp_Var4[6] = (_func_int *)0x9;
LAB_00154a5e:
  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var4;
  std::__cxx11::string::~string((string *)&shape);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::OnAcknowledgements(
    const uint8_t* data,
    unsigned bytes,
    Counter64 ackNonce,
    uint64_t receiveUsec)
{
    if (bytes < kAckOverheadBytes) {
        return Result("SessionOutgoing::OnAcknowledgements", "Truncated Ack", ErrorType::Tonk, Tonk_InvalidData);
    }

    // If ack was received out of order:
    if (ackNonce < LastAck.NextAcceptableNonce)
    {
        Deps.Logger->Debug("Ignored re-ordered ack");
        return Result::Success();
    }
    LastAck.NextAcceptableNonce = ackNonce + 1;

    // Decompress nonce field back to full size
    const Counter24 partialNonce = siamese::ReadU24_LE(data);
    const Counter64 recovered = Counter64::ExpandFromTruncated(LastAck.PeerNextExpectedNonce, partialNonce);

    // If ack was sent out of order:
    if (recovered < LastAck.PeerNextExpectedNonce) {
        return Result("SessionOutgoing::OnAcknowledgements", "Ack was sent out of order", ErrorType::Tonk, Tonk_InvalidData);
    }

    // If there is Ack data attached:
    if (bytes > kAckOverheadBytes)
    {
        // Process acknowledgement with encoder
        const int ackResult = siamese_encoder_ack(
            FECEncoder,
            data + kAckOverheadBytes,
            bytes - kAckOverheadBytes,
            &LastAck.PeerNextExpectedSeqNum);

        if (Siamese_Success != ackResult) {
            return Result("SessionOutgoing::OnAcknowledgements", "siamese_encoder_ack failed", ErrorType::Siamese, ackResult);
        }
    }

    // Message is validated - update state
    LastAck.PeerNextExpectedNonce = recovered;
    LastAck.ReceiveUsec = receiveUsec;

    // Update bandwidth control with realtime feedback
    BandwidthShape shape;
    shape.Decompress(data + 3);
    Deps.SenderControl->OnReceiverFeedback(shape);

    // If the peer is now caught up:
    if (PeerCaughtUp())
    {
        TONK_VERBOSE_OUTGOING_LOG("Peer caught up - sending AckAck for seqno=", LastAck.PeerNextExpectedSeqNum);

        // Send an AckAck
        uint8_t ackack[4];
        siamese::WriteU24_LE_Min4Bytes(ackack, LastAck.PeerNextExpectedSeqNum);

        return QueueUnreliable(
            protocol::MessageType_AckAck,
            ackack,
            protocol::kAckAckBytes);
    }

    TONK_VERBOSE_OUTGOING_LOG("Got Ack PeerNextExpectedSeq=", LastAck.PeerNextExpectedSeqNum,
        " PeerNextExpectedNonce=", LastAck.PeerNextExpectedNonce.ToUnsigned(), " bytes=", bytes);

    return Result::Success();
}